

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O1

void __thiscall
Js::FunctionWithComputedName<Js::ScriptFunction>::FunctionWithComputedName
          (FunctionWithComputedName<Js::ScriptFunction> *this,FunctionProxy *proxy,
          ScriptFunctionType *deferredPrototypeType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  ScriptFunction::ScriptFunction(&this->super_ScriptFunction,proxy,deferredPrototypeType);
  (this->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.super_DynamicObject
  .super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_0153eba8;
  (this->computedNameVar).ptr = (void *)0x0;
  if ((((proxy->functionInfo).ptr)->attributes & ComputedName) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x28,"(proxy->GetFunctionInfo()->HasComputedName())",
                                "proxy->GetFunctionInfo()->HasComputedName()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionWithComputedName(FunctionProxy * proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), computedNameVar(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasComputedName());
        }